

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O3

curses_drawing_info * load_nh_drawing_info(nh_drawing_info *orig)

{
  wchar_t len;
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  curses_drawing_info *pcVar4;
  curses_symdef_conflict *pcVar5;
  
  pcVar4 = (curses_drawing_info *)malloc(0x90);
  len = orig->num_bgelements;
  wVar1 = orig->num_traps;
  wVar2 = orig->num_objects;
  wVar3 = orig->num_monsters;
  pcVar4->num_bgelements = orig->num_bgelements;
  pcVar4->num_traps = wVar1;
  pcVar4->num_objects = wVar2;
  pcVar4->num_monsters = wVar3;
  wVar1 = orig->num_expltypes;
  wVar2 = orig->num_zaptypes;
  wVar3 = orig->num_effects;
  pcVar4->num_warnings = orig->num_warnings;
  pcVar4->num_expltypes = wVar1;
  pcVar4->num_zaptypes = wVar2;
  pcVar4->num_effects = wVar3;
  pcVar4->bg_feature_offset = orig->bg_feature_offset;
  pcVar5 = load_nh_symarray(orig->bgelements,len);
  pcVar4->bgelements = pcVar5;
  pcVar5 = load_nh_symarray(orig->traps,orig->num_traps);
  pcVar4->traps = pcVar5;
  pcVar5 = load_nh_symarray(orig->objects,orig->num_objects);
  pcVar4->objects = pcVar5;
  pcVar5 = load_nh_symarray(orig->monsters,orig->num_monsters);
  pcVar4->monsters = pcVar5;
  pcVar5 = load_nh_symarray(orig->warnings,orig->num_warnings);
  pcVar4->warnings = pcVar5;
  pcVar5 = load_nh_symarray(orig->invis,L'\x01');
  pcVar4->invis = pcVar5;
  pcVar5 = load_nh_symarray(orig->effects,orig->num_effects);
  pcVar4->effects = pcVar5;
  pcVar5 = load_nh_symarray(orig->expltypes,orig->num_expltypes);
  pcVar4->expltypes = pcVar5;
  pcVar5 = load_nh_symarray(orig->explsyms,L'\t');
  pcVar4->explsyms = pcVar5;
  pcVar5 = load_nh_symarray(orig->zaptypes,orig->num_zaptypes);
  pcVar4->zaptypes = pcVar5;
  pcVar5 = load_nh_symarray(orig->zapsyms,L'\x04');
  pcVar4->zapsyms = pcVar5;
  pcVar5 = load_nh_symarray(orig->breathsyms,L'\x04');
  pcVar4->breathsyms = pcVar5;
  pcVar5 = load_nh_symarray(orig->swallowsyms,L'\b');
  pcVar4->swallowsyms = pcVar5;
  return pcVar4;
}

Assistant:

static struct curses_drawing_info *load_nh_drawing_info(const struct nh_drawing_info *orig)
{
    struct curses_drawing_info *copy = malloc(sizeof(struct curses_drawing_info));
    
    copy->num_bgelements = orig->num_bgelements;
    copy->num_traps = orig->num_traps;
    copy->num_objects = orig->num_objects;
    copy->num_monsters = orig->num_monsters;
    copy->num_warnings = orig->num_warnings;
    copy->num_expltypes = orig->num_expltypes;
    copy->num_zaptypes = orig->num_zaptypes;
    copy->num_effects = orig->num_effects;
    copy->bg_feature_offset = orig->bg_feature_offset;
    
    copy->bgelements = load_nh_symarray(orig->bgelements, orig->num_bgelements);
    copy->traps = load_nh_symarray(orig->traps, orig->num_traps);
    copy->objects = load_nh_symarray(orig->objects, orig->num_objects);
    copy->monsters = load_nh_symarray(orig->monsters, orig->num_monsters);
    copy->warnings = load_nh_symarray(orig->warnings, orig->num_warnings);
    copy->invis = load_nh_symarray(orig->invis, 1);
    copy->effects = load_nh_symarray(orig->effects, orig->num_effects);
    copy->expltypes = load_nh_symarray(orig->expltypes, orig->num_expltypes);
    copy->explsyms = load_nh_symarray(orig->explsyms, NUMEXPCHARS);
    copy->zaptypes = load_nh_symarray(orig->zaptypes, orig->num_zaptypes);
    copy->zapsyms = load_nh_symarray(orig->zapsyms, NUMZAPCHARS);
    copy->breathsyms = load_nh_symarray(orig->breathsyms, NUMBREATHCHARS);
    copy->swallowsyms = load_nh_symarray(orig->swallowsyms, NUMSWALLOWCHARS);
    
    return copy;
}